

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<double>_>::TPZSkylMatrix(TPZSkylMatrix<std::complex<double>_> *this)

{
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylMatrix_0187abb0;
  (this->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0187cda8;
  (this->fElem).fStore = (complex<double> **)0x0;
  (this->fElem).fNElements = 0;
  (this->fElem).fNAlloc = 0;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
  (this->fStorage).fStore = (complex<double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  return;
}

Assistant:

TPZSavable() : TPZRegisterClassId(&TPZSavable::ClassId) { }